

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter.h
# Opt level: O0

void __thiscall
spdlog::details::e_formatter::format(e_formatter *this,log_msg *msg,tm *param_2,memory_buffer *dest)

{
  bool bVar1;
  rep rVar2;
  undefined1 local_60 [8];
  scoped_pad p;
  size_t field_size;
  duration<long,_std::ratio<1L,_1000L>_> millis;
  memory_buffer *dest_local;
  tm *param_2_local;
  log_msg *msg_local;
  e_formatter *this_local;
  
  millis.__r = (rep)dest;
  field_size = (size_t)fmt_helper::time_fraction<std::chrono::duration<long,std::ratio<1l,1000l>>>
                                 (&msg->time);
  bVar1 = padding_info::enabled(&(this->super_flag_formatter).padinfo_);
  if (bVar1) {
    p.spaces_._M_str = (char *)0x3;
    scoped_pad::scoped_pad
              ((scoped_pad *)local_60,3,&(this->super_flag_formatter).padinfo_,
               (memory_buffer *)millis.__r);
    rVar2 = std::chrono::duration<long,_std::ratio<1L,_1000L>_>::count
                      ((duration<long,_std::ratio<1L,_1000L>_> *)&field_size);
    fmt_helper::pad3<unsigned_int,500ul>
              ((uint)rVar2,(basic_memory_buffer<char,_500UL,_std::allocator<char>_> *)millis.__r);
    scoped_pad::~scoped_pad((scoped_pad *)local_60);
  }
  else {
    rVar2 = std::chrono::duration<long,_std::ratio<1L,_1000L>_>::count
                      ((duration<long,_std::ratio<1L,_1000L>_> *)&field_size);
    fmt_helper::pad3<unsigned_int,500ul>
              ((uint)rVar2,(basic_memory_buffer<char,_500UL,_std::allocator<char>_> *)millis.__r);
  }
  return;
}

Assistant:

void format(const details::log_msg &msg, const std::tm &, fmt::memory_buffer &dest) override
    {
        auto millis = fmt_helper::time_fraction<std::chrono::milliseconds>(msg.time);
        if (padinfo_.enabled())
        {
            const size_t field_size = 3;
            scoped_pad p(field_size, padinfo_, dest);
            fmt_helper::pad3(static_cast<uint32_t>(millis.count()), dest);
        }
        else
        {
            fmt_helper::pad3(static_cast<uint32_t>(millis.count()), dest);
        }
    }